

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

FilePath * testing::internal::GetCurrentExecutableName(void)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  long lVar4;
  FilePath *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  undefined1 local_60 [8];
  FilePath result;
  long local_38;
  long local_30 [2];
  
  psVar1 = &result.pathname_._M_string_length;
  result.pathname_._M_dataplus._M_p = (pointer)0x0;
  result.pathname_._M_string_length._0_1_ = 0;
  local_60 = (undefined1  [8])psVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pcVar2 = ((local_78.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  result.pathname_.field_2._8_8_ = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&result.pathname_.field_2 + 8),pcVar2,
             pcVar2 + (local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  uVar3 = result.pathname_.field_2._8_8_;
  if (local_38 != 0) {
    lVar4 = 0;
    do {
      if (((*(char *)(result.pathname_.field_2._8_8_ + lVar4) != '/') ||
          (uVar3 == result.pathname_.field_2._8_8_)) || (*(char *)(uVar3 + -1) != '/')) {
        *(char *)uVar3 = *(char *)(result.pathname_.field_2._8_8_ + lVar4);
        uVar3 = uVar3 + 1;
      }
      lVar4 = lVar4 + 1;
    } while (local_38 != lVar4);
  }
  *(char *)uVar3 = '\0';
  std::__cxx11::string::_M_assign((string *)local_60);
  if ((long *)result.pathname_.field_2._8_8_ != local_30) {
    operator_delete((void *)result.pathname_.field_2._8_8_,local_30[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  FilePath::RemoveDirectoryName(in_RDI,(FilePath *)local_60);
  if (local_60 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_60,
                    CONCAT71(result.pathname_._M_string_length._1_7_,
                             (undefined1)result.pathname_._M_string_length) + 1);
  }
  return in_RDI;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS || GTEST_OS_OS2
  result.Set(FilePath(GetArgvs()[0]).RemoveExtension("exe"));
#else
  result.Set(FilePath(GetArgvs()[0]));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}